

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_randomized_insert(planck_unit_test_t *tc)

{
  ion_sl_node_t *piVar1;
  sl_node *psVar2;
  sl_node *psVar3;
  planck_unit_result_t pVar4;
  int iVar5;
  ion_status_t iVar6;
  ion_sl_node_t **ppiVar7;
  int iVar8;
  bool bVar9;
  int key;
  ion_byte_t str [10];
  ion_skiplist_t skiplist;
  
  initialize_skiplist_std_conditions(&skiplist);
  builtin_memcpy(str,"random",7);
  iVar8 = 100;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    iVar5 = rand();
    key = iVar5 % 0x65;
    iVar6 = sl_insert(&skiplist,&key,str);
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(iVar6.error == '\0'),0x123,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar4 == '\0') goto LAB_00101a08;
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(iVar6.count == 1),0x124,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar4 == '\0') goto LAB_00101a08;
  }
  ppiVar7 = &skiplist.head;
  while( true ) {
    piVar1 = *ppiVar7;
    psVar2 = *piVar1->next;
    psVar3 = *psVar2->next;
    if (psVar3 == (sl_node *)0x0) {
      sl_destroy(&skiplist);
      return;
    }
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(*psVar2->key <= *psVar3->key),0x131,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar4 == '\0') break;
    ppiVar7 = piVar1->next;
  }
LAB_00101a08:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_randomized_insert(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t str[10];

	strcpy((char *) str, "random");

	int i;

	for (i = 0; i < 100; i++) {
		int key				= rand() % 101;

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, str);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor = skiplist.head;

	while (cursor->next[0]->next[0] != NULL) {
		int now		= *((int *) cursor->next[0]->key);
		int next	= *((int *) cursor->next[0]->next[0]->key);

		PLANCK_UNIT_ASSERT_TRUE(tc, next >= now);

		cursor = cursor->next[0];
	}

	sl_destroy(&skiplist);
}